

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lazy.h
# Opt level: O0

ValueAwaiter __thiscall
async_simple::coro::Lazy<cinatra::resp_data>::coAwait(Lazy<cinatra::resp_data> *this,Executor *ex)

{
  LazyPromise<cinatra::resp_data> *pLVar1;
  Executor *in_RDX;
  Handle in_RSI;
  char *in_RDI;
  Handle HVar2;
  
  HVar2.__handle_ = in_RDI;
  std::coroutine_handle::operator_cast_to_bool((coroutine_handle *)in_RSI.__handle_);
  logicAssert(SUB81((ulong)HVar2.__handle_ >> 0x38,0),in_RDI);
  pLVar1 = std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::resp_data>_>::
           promise((coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::resp_data>_> *
                   )in_RSI.__handle_);
  (pLVar1->super_LazyPromiseBase)._executor = in_RDX;
  std::
  exchange<std::coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::resp_data>>,decltype(nullptr)>
            ((coroutine_handle<async_simple::coro::detail::LazyPromise<cinatra::resp_data>_> *)
             in_RDX,(void **)0x2a8cf4);
  detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::ValueAwaiter
            ((ValueAwaiter *)in_RDX,in_RSI);
  return (ValueAwaiter)(Handle)HVar2.__handle_;
}

Assistant:

auto coAwait(Executor* ex) {
        logicAssert(this->_coro.operator bool(),
                    "Lazy do not have a coroutine_handle "
                    "Maybe the allocation failed or you're using a used Lazy");

        // derived lazy inherits executor
        this->_coro.promise()._executor = ex;
        return typename Base::ValueAwaiter(std::exchange(this->_coro, nullptr));
    }